

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::SharedDtor(CodeGeneratorResponse *this)

{
  string *this_00;
  CodeGeneratorResponse *this_local;
  
  if ((this->error_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (this_00 = this->error_, this_00 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  return;
}

Assistant:

void CodeGeneratorResponse::SharedDtor() {
  if (error_ != &::google::protobuf::internal::kEmptyString) {
    delete error_;
  }
  if (this != default_instance_) {
  }
}